

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat * __thiscall Mat::dot(Mat *__return_storage_ptr__,Mat *this,Mat *a)

{
  pointer p_Var1;
  pointer p_Var2;
  pointer p_Var3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  Mat(__return_storage_ptr__,this->r,this->c);
  uVar10 = this->c * this->r;
  p_Var1 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var2 = (a->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var3 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar12 = 0;
  uVar11 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar11 = uVar12;
  }
  for (; uVar11 * 0x10 != uVar12; uVar12 = uVar12 + 0x10) {
    uVar4 = *(ulong *)((long)p_Var1 + uVar12);
    uVar5 = *(ulong *)((long)p_Var2 + uVar12);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar5;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar4;
    lVar6 = *(long *)((long)p_Var1 + uVar12 + 8);
    lVar7 = *(long *)((long)p_Var2 + uVar12 + 8);
    *(long *)((long)p_Var3 + uVar12) = SUB168(auVar8 * auVar9,0);
    *(ulong *)((long)p_Var3 + uVar12 + 8) =
         uVar4 * lVar7 + uVar5 * lVar6 + SUB168(auVar8 * auVar9,8);
  }
  residual(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::dot(const Mat &a) {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = val[i] * a.val[i];
    }
    ret.residual();
    return ret;
}